

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O0

void __thiscall
QOpenGLFramebufferObjectPrivate::initColorBuffer
          (QOpenGLFramebufferObjectPrivate *this,int idx,GLint *samples)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  ulong uVar5;
  QOpenGLFunctions *this_00;
  QOpenGLSharedResourceGuard *func;
  GLenum *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  GLenum storageFormat;
  ColorAttachment *color;
  QOpenGLContext *ctx;
  GLuint color_buffer;
  QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *in_stack_ffffffffffffff98;
  GLenum target;
  QOpenGLFunctions *in_stack_ffffffffffffffa0;
  GLuint id;
  GLsizei in_stack_ffffffffffffffa8;
  GLenum target_00;
  GLenum local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::currentContext();
  pvVar4 = QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>::operator[]
                     (in_stack_ffffffffffffff98,0x149172);
  local_3c = pvVar4->internalFormat;
  uVar5 = QOpenGLContext::isOpenGLES();
  if ((uVar5 & 1) != 0) {
    if (pvVar4->internalFormat == 0x1908) {
      uVar5 = QOpenGLExtensions::hasOpenGLExtension((int)in_RDI + StencilWrap);
      if ((uVar5 & 1) == 0) {
        local_3c = 0x8056;
      }
      else {
        local_3c = 0x8058;
      }
    }
    else if (pvVar4->internalFormat == 0x8052) {
      local_3c = 0x8059;
    }
  }
  QOpenGLFunctions::glGenRenderbuffers
            (in_stack_ffffffffffffffa0,(GLsizei)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (GLuint *)0x149200);
  QOpenGLFunctions::glBindRenderbuffer
            (in_stack_ffffffffffffffa0,(GLenum)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (GLuint)in_stack_ffffffffffffff98);
  this_00 = (QOpenGLFunctions *)(in_RDI + 0x40);
  target_00 = *in_RDX;
  iVar3 = QSize::width((QSize *)0x149242);
  QSize::height((QSize *)0x149250);
  QOpenGLExtraFunctions::glRenderbufferStorageMultisample
            ((QOpenGLExtraFunctions *)CONCAT44(iVar3,local_3c),target_00,in_stack_ffffffffffffffa8,
             (GLenum)((ulong)this_00 >> 0x20),(GLsizei)this_00,
             (GLsizei)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  QOpenGLFunctions::glFramebufferRenderbuffer
            (this_00,(GLenum)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (GLenum)in_stack_ffffffffffffff98,0,0x149296);
  bVar2 = checkFramebufferStatus
                    ((QOpenGLFramebufferObjectPrivate *)
                     CONCAT44(target_00,in_stack_ffffffffffffffa8),(QOpenGLContext *)this_00);
  *(byte *)(in_RDI + 0x34) = *(byte *)(in_RDI + 0x34) & 0xfe | bVar2;
  target = (GLenum)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if ((*(byte *)(in_RDI + 0x34) & 1) == 0) {
    QOpenGLFunctions::glDeleteRenderbuffers(this_00,target,(GLuint *)0x149339);
  }
  else {
    QOpenGLFunctions::glGetRenderbufferParameteriv
              (this_00,target,(GLenum)in_stack_ffffffffffffff98,(GLint *)0x1492ec);
    id = (GLuint)((ulong)this_00 >> 0x20);
    func = (QOpenGLSharedResourceGuard *)operator_new(0x20);
    QOpenGLSharedResourceGuard::QOpenGLSharedResourceGuard
              ((QOpenGLSharedResourceGuard *)CONCAT44(iVar3,local_3c),
               (QOpenGLContext *)CONCAT44(target_00,in_stack_ffffffffffffffa8),id,
               (FreeResourceFunc)func);
    pvVar4->guard = func;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLFramebufferObjectPrivate::initColorBuffer(int idx, GLint *samples)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    GLuint color_buffer = 0;

    ColorAttachment &color(colorAttachments[idx]);

    GLenum storageFormat = color.internalFormat;
    // ES requires a sized format. The older desktop extension does not. Correct the format on ES.
    if (ctx->isOpenGLES()) {
        if (color.internalFormat == GL_RGBA) {
            if (funcs.hasOpenGLExtension(QOpenGLExtensions::Sized8Formats))
                storageFormat = GL_RGBA8;
            else
                storageFormat = GL_RGBA4;
        } else if (color.internalFormat == GL_RGB10) {
            // GL_RGB10 is not allowed in ES for glRenderbufferStorage.
            storageFormat = GL_RGB10_A2;
        }
    }

    funcs.glGenRenderbuffers(1, &color_buffer);
    funcs.glBindRenderbuffer(GL_RENDERBUFFER, color_buffer);
    funcs.glRenderbufferStorageMultisample(GL_RENDERBUFFER, *samples, storageFormat, color.size.width(), color.size.height());
    funcs.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + idx,
                                    GL_RENDERBUFFER, color_buffer);

    QT_CHECK_GLERROR();
    valid = checkFramebufferStatus(ctx);
    if (valid) {
        // Query the actual number of samples. This can be greater than the requested
        // value since the typically supported values are 0, 4, 8, ..., and the
        // requests are mapped to the next supported value.
        funcs.glGetRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, samples);
        color.guard = new QOpenGLSharedResourceGuard(ctx, color_buffer, freeRenderbufferFunc);
    } else {
        funcs.glDeleteRenderbuffers(1, &color_buffer);
    }
}